

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::ExpParameter::InternalSerializeWithCachedSizesToArray
          (ExpParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  uint8 *puVar4;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 2) != 0) {
    fVar1 = this->base_;
    *target = '\r';
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar2 & 4) != 0) {
    fVar1 = this->scale_;
    *target = '\x15';
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar2 & 1) != 0) {
    fVar1 = this->shift_;
    *target = '\x1d';
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    return target;
  }
  puVar4 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
  return puVar4;
}

Assistant:

::google::protobuf::uint8* ExpParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ExpParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional float base = 1 [default = -1];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(1, this->base(), target);
  }

  // optional float scale = 2 [default = 1];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(2, this->scale(), target);
  }

  // optional float shift = 3 [default = 0];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(3, this->shift(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ExpParameter)
  return target;
}